

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O2

uchar * cppcms::b64url::encode(uchar *begin,uchar *end,uchar *target)

{
  size_t sVar1;
  
  for (sVar1 = (long)end - (long)begin; 2 < (long)sVar1; sVar1 = sVar1 - 3) {
    anon_unknown.dwarf_12914c::bencode(begin,target,3);
    begin = begin + 3;
    target = target + 4;
  }
  if (begin != end) {
    sVar1 = anon_unknown.dwarf_12914c::bencode(begin,target,sVar1);
    target = target + sVar1;
  }
  return target;
}

Assistant:

unsigned char *encode(unsigned char const *begin,unsigned char const *end,unsigned char *target)
{
	while(end - begin >=3) {
		bencode(begin,target,3);
		begin += 3;
		target += 4;
	}
	if(end!=begin)
		target+=bencode(begin,target,end-begin);
	return target;
}